

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O3

void __thiscall tst_qpromise_timeout::rejectedStdChrono(tst_qpromise_timeout *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  anon_class_24_3_494f60a1 callback;
  _func_int **pp_Var3;
  int *piVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar6;
  PromiseData<int> *this_00;
  PromiseResolver<int> PVar7;
  bool bVar8;
  char cVar9;
  PromiseData<int> *pPVar10;
  QSlotObjectBase *pQVar11;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<int> *pPVar12;
  char *pcVar13;
  char *pcVar14;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar15;
  QByteArrayView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QPromise<int> local_198;
  QArrayData *local_188;
  PromiseData<int> *pPStack_180;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_170;
  PromiseData<int> *local_168;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_150;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_128;
  PromiseResolver<int> resolver_2;
  QString local_108;
  QSharedData *local_f0;
  PromiseResolver<void> resolver_1;
  _Manager_type local_d8;
  QString local_c8;
  QSharedData *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  undefined1 local_60 [8];
  qint64 elapsed;
  _func_int **local_50;
  _func_int **local_48;
  QElapsedTimer timer;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  QElapsedTimer::start();
  pPVar10 = (PromiseData<int> *)operator_new(0x68);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = (_func_int **)&PTR__PromiseDataBase_0011eb88;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011eb88;
  QReadWriteLock::QReadWriteLock
            (&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  local_50 = (_func_int **)&PTR__PromiseData_0011eb10;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0011eb10;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar1 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b0 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_198.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ead8;
  local_198.super_QPromiseBase<int>.m_d.d = pPVar10;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,&local_198);
  local_170.d = (Data *)&PTR__QPromiseBase_0011eaa8;
  local_198.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011eaa8;
  if (local_198.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_198.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_198.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_198.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar7.m_d.d = resolver.m_d.d;
  bVar8 = true;
  if (resolver.m_d.d == (Data *)0x0) {
LAB_001088f2:
    QVar15.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) goto LAB_001088f2;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar8 = false;
    QVar15 = resolver.m_d.d;
  }
  pQVar11 = (QSlotObjectBase *)operator_new(0x18);
  if (bVar8) {
    (pQVar11->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar11->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:138:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(undefined8 *)(pQVar11 + 1) = 0;
  }
  else {
    LOCK();
    ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (pQVar11->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar11->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:138:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(Data **)(pQVar11 + 1) = QVar15.d;
    LOCK();
    ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QTimer::singleShotImpl(1000,PreciseTimer,(QObject *)0x0,pQVar11);
  QVar6.d = local_170.d;
  if (!bVar8) {
    LOCK();
    ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar15.d,0x10);
    }
    LOCK();
    ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar15.d,0x10);
    }
    LOCK();
    ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar15.d,0x10);
    }
    LOCK();
    ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar15.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar15.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  local_198.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)local_60;
  local_60 = (undefined1  [8])&PTR__QException_0011ea58;
  local_198.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&resolver_1;
  resolver_1.m_d.d._0_4_ = 2000;
  LOCK();
  pQVar1 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ead8;
  callback.error = (QPromiseTimeoutException *)local_198.super_QPromiseBase<int>.m_d.d;
  callback.msec = (int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase;
  callback.p = (QPromise<int> *)&resolver;
  local_188 = (QArrayData *)&resolver;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:122:24),_0>
            ((QPromiseBase<int> *)&local_c8,callback);
  local_c8.d.d = (Data *)&PTR__QPromiseBase_0011ead8;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)QVar6.d;
  if (pPVar10 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPVar10 != (PromiseData<int> *)0x0)) {
      (*(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if ((PromiseData<int> *)local_c8.d.ptr != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_c8.d.ptr)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_168 = (PromiseData<int> *)local_c8.d.ptr;
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ecf8;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ec90;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_f0 = &this_01->super_QSharedData;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ec28;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ec70;
  if (this_01 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &this_01->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (this_01 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*this_01->_vptr_PromiseDataBase[1])();
    }
  }
  pp_Var3 = (_func_int **)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  local_198.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var3;
  if (pp_Var3 == (_func_int **)0x0) {
    local_198.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
LAB_00108bd8:
    local_198.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    bVar8 = true;
  }
  else {
    LOCK();
    *(int *)pp_Var3 = *(int *)pp_Var3 + 1;
    UNLOCK();
    local_198.super_QPromiseBase<int>.m_d.d =
         (PromiseData<int> *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
    if (local_198.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)pp_Var3 = *(int *)pp_Var3 + 1;
      UNLOCK();
      goto LAB_00108bd8;
    }
    LOCK();
    *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
             super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
    UNLOCK();
    LOCK();
    *(int *)pp_Var3 = *(int *)pp_Var3 + 1;
    UNLOCK();
    LOCK();
    *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
             super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
    UNLOCK();
    bVar8 = false;
  }
  QVar5.d = local_198.super_QPromiseBase<int>.m_d.d;
  pPStack_180 = (PromiseData<int> *)&timer;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_188 = (QArrayData *)&elapsed;
  local_88._M_unused._M_object = operator_new(0x20);
  *(_func_int ***)local_88._M_unused._0_8_ = local_198.super_QPromiseBase<int>._vptr_QPromiseBase;
  if (local_198.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 8) =
       local_198.super_QPromiseBase<int>.m_d.d;
  if (local_198.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
    *(QArrayData **)((long)local_88._M_unused._0_8_ + 0x10) = local_188;
    *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 0x18) = pPStack_180;
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
             super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
    UNLOCK();
    *(QArrayData **)((long)local_88._M_unused._0_8_ + 0x10) = local_188;
    *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 0x18) = pPStack_180;
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if (local_198.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
               super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                    super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + -1;
      UNLOCK();
      if (*(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                   super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase == 0) {
        operator_delete(local_198.super_QPromiseBase<int>.m_d.d,0x10);
      }
    }
  }
  if (local_198.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
      operator_delete(local_198.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&local_168->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (pp_Var3 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var3 = *(int *)pp_Var3 + 1;
    UNLOCK();
  }
  if (!bVar8) {
    LOCK();
    *(int *)&((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
         + 1;
    UNLOCK();
  }
  pPStack_180 = (PromiseData<int> *)&timer;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_198.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var3;
  local_198.super_QPromiseBase<int>.m_d.d = QVar5.d;
  local_188 = (QArrayData *)&elapsed;
  local_a8._M_unused._M_object = operator_new(0x20);
  this_00 = local_168;
  *(_func_int ***)local_a8._M_unused._0_8_ = local_198.super_QPromiseBase<int>._vptr_QPromiseBase;
  if (local_198.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  *(PromiseData<int> **)((long)local_a8._M_unused._0_8_ + 8) =
       local_198.super_QPromiseBase<int>.m_d.d;
  if (local_198.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
    *(QArrayData **)((long)local_a8._M_unused._0_8_ + 0x10) = local_188;
    *(PromiseData<int> **)((long)local_a8._M_unused._0_8_ + 0x18) = pPStack_180;
    pcStack_90 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
             super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
    UNLOCK();
    *(QArrayData **)((long)local_a8._M_unused._0_8_ + 0x10) = local_188;
    *(PromiseData<int> **)((long)local_a8._M_unused._0_8_ + 0x18) = pPStack_180;
    pcStack_90 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if (local_198.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
               super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                    super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + -1;
      UNLOCK();
      if (*(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                   super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase == 0) {
        operator_delete(local_198.super_QPromiseBase<int>.m_d.d,0x10);
      }
    }
  }
  if (local_198.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
      operator_delete(local_198.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (!bVar8) {
    LOCK();
    *(int *)&((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
         + -1;
    UNLOCK();
    if (*(int *)&((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
        == 0) {
      operator_delete(QVar5.d,0x10);
    }
  }
  QVar15.d = local_170.d;
  if (pp_Var3 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var3 = *(int *)pp_Var3 + -1;
    UNLOCK();
    if (*(int *)pp_Var3 == 0) {
      operator_delete(pp_Var3,0x10);
    }
  }
  piVar4 = (int *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      operator_delete((void *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_),0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)QVar15.d;
  pPVar12 = (PromiseData<int> *)operator_new(0x68);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_48;
  QReadWriteLock::QReadWriteLock
            (&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_50;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar12 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108.d.d = (Data *)&PTR__QPromiseBase_0011ead8;
  p.super_QPromiseBase<int>.m_d.d = pPVar12;
  local_108.d.ptr = (char16_t *)pPVar12;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,(QPromise<int> *)&local_108);
  local_108.d.d = (Data *)QVar15.d;
  if ((PromiseData<int> *)local_108.d.ptr != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_108.d.ptr)->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_108.d.ptr != (PromiseData<int> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_108.d.ptr)->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_128.d = (Data *)0x0;
    local_150.d = (Data *)0x0;
    goto LAB_00109010;
  }
  LOCK();
  *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
  UNLOCK();
  local_128 = resolver_2.m_d.d;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_150.d = (Data *)0x0;
LAB_00108ffb:
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    if ((PromiseData<int> *)local_150.d == (PromiseData<int> *)0x0) goto LAB_00109010;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_150 = resolver_2.m_d.d;
    if (resolver_2.m_d.d != (Data *)0x0) goto LAB_00108ffb;
  }
  LOCK();
  *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_150.d)->super_QSharedData)->
           _vptr_PromiseDataBase =
       *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_150.d)->super_QSharedData)->
                _vptr_PromiseDataBase + 1;
  UNLOCK();
LAB_00109010:
  pPStack_180 = this_00;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_188 = (QArrayData *)&PTR__QPromiseBase_0011ead8;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  local_198.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_128.d;
  local_198.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)local_150.d;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x20);
  *(_func_int ***)resolver.m_d.d = local_198.super_QPromiseBase<int>._vptr_QPromiseBase;
  if ((QArrayData *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_198.super_QPromiseBase<int>.m_d.d;
  if (local_198.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
             super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
    UNLOCK();
  }
  *(Data **)((long)resolver.m_d.d + 0x10) = QVar15.d;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)pPStack_180;
  if (pPStack_180 == (PromiseData<int> *)0x0) {
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0011ead8;
    local_188 = (QArrayData *)QVar15.d;
  }
  else {
    LOCK();
    pQVar2 = &(pPStack_180->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0011ead8;
    local_188 = (QArrayData *)QVar15.d;
    if (pPStack_180 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar2 = &(pPStack_180->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (pPStack_180 != (PromiseData<int> *)0x0)) {
        (*(pPStack_180->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  if (local_198.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
             super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         *(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + -1;
    UNLOCK();
    if (*(int *)&((local_198.super_QPromiseBase<int>.m_d.d)->
                 super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase == 0) {
      operator_delete(local_198.super_QPromiseBase<int>.m_d.d,0x10);
    }
  }
  if ((QArrayData *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_198.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
        super___atomic_base<int>._M_i == 0) {
      operator_delete(local_198.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_01,(function<void_()> *)&resolver);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver_1,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_128,
             (QPromiseResolve<int> *)&local_150,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver_1);
  if (local_d8 != (_Manager_type)0x0) {
    (*local_d8)((_Any_data *)&resolver_1,(_Any_data *)&resolver_1,__destroy_functor);
  }
  if ((PromiseData<int> *)local_150.d != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_150.d)->super_QSharedData)->
             _vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_150.d)->super_QSharedData)->
                  _vptr_PromiseDataBase + -1;
    UNLOCK();
    if (*(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_150.d)->super_QSharedData)->
                 _vptr_PromiseDataBase == 0) {
      operator_delete(local_150.d,0x10);
    }
  }
  if ((QArrayData *)local_128.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_128.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_128.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ead8;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (local_f0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_f0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_f0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  pQVar1 = local_b0;
  local_c8.d.d = (Data *)QVar15.d;
  if ((PromiseData<int> *)local_c8.d.ptr != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_c8.d.ptr)->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_c8.d.ptr != (PromiseData<int> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_c8.d.ptr)->_vptr_PromiseDataBase[1])();
    }
  }
  QException::~QException((QException *)local_60);
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(pPVar10);
  }
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  waitForError<int,QString>(&local_108,&p,&local_c8);
  QVar16.m_data = (storage_type *)0x3;
  QVar16.m_size = (qsizetype)&local_198;
  QString::fromUtf8(QVar16);
  pp_Var3 = local_198.super_QPromiseBase<int>._vptr_QPromiseBase;
  QVar17.m_data = local_108.d.ptr;
  QVar17.m_size = local_108.d.size;
  QVar18.m_data = (storage_type_conflict *)local_198.super_QPromiseBase<int>.m_d.d;
  QVar18.m_size = (qsizetype)local_188;
  cVar9 = QTest::qCompare(QVar17,QVar18,"waitForError(p, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                          ,0x92);
  if ((QArrayData *)pp_Var3 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pp_Var3,2,8);
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar5.d = p.super_QPromiseBase<int>.m_d.d;
  if (cVar9 == '\0') {
    if (p.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      return;
    }
  }
  else {
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar8 = (bool)(~bVar8 & ((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object != (void *)0x0);
    local_198.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_198.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar8);
    local_108.d.d = (Data *)CONCAT71(local_108.d.d._1_7_,1);
    pcVar13 = QTest::toString<bool>((bool *)&local_198);
    pcVar14 = QTest::toString<bool>((bool *)&local_108);
    cVar9 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar13,pcVar14,"p.isRejected()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x93);
    if (cVar9 != '\0') {
      QTest::qVerify(elapsed < 2000,"elapsed < 2000","",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                     ,0x94);
    }
  }
  LOCK();
  pQVar1 = &((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_170;
    (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
      _vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_qpromise_timeout::rejectedStdChrono()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>&,
                                         const QtPromise::QPromiseReject<int>& reject) {
                 QTimer::singleShot(1000, [=]() {
                     reject(QString{"foo"});
                 });
             }}.timeout(std::chrono::seconds{2})
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QVERIFY(elapsed < 2000);
}